

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnection.cpp
# Opt level: O2

bool __thiscall FIX::SocketConnection::processQueue(SocketConnection *this)

{
  Queue *this_00;
  _Elt_pointer pbVar1;
  int iVar2;
  size_type sVar3;
  ssize_t sVar4;
  size_type sVar5;
  bool bVar6;
  pollfd pfd;
  
  Mutex::lock(&this->m_mutex);
  this_00 = &this->m_sendQueue;
  sVar3 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(this_00);
  if (sVar3 == 0) {
    bVar6 = true;
  }
  else {
    pfd.fd = this->m_socket;
    pfd.events = 4;
    pfd.revents = 0;
    iVar2 = poll((pollfd *)&pfd,1,0);
    if (iVar2 < 1) {
      bVar6 = false;
    }
    else {
      pbVar1 = (this->m_sendQueue).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      sVar4 = socket_send(this->m_socket,(pbVar1->_M_dataplus)._M_p + this->m_sendLength,
                          pbVar1->_M_string_length - this->m_sendLength);
      sVar5 = this->m_sendLength;
      if (0 < sVar4) {
        sVar5 = sVar5 + sVar4;
        this->m_sendLength = sVar5;
      }
      if (sVar5 == pbVar1->_M_string_length) {
        this->m_sendLength = 0;
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_front(this_00);
      }
      sVar3 = std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(this_00);
      bVar6 = sVar3 == 0;
    }
  }
  Mutex::unlock(&this->m_mutex);
  return bVar6;
}

Assistant:

bool SocketConnection::processQueue() {
  Locker l(m_mutex);

  if (!m_sendQueue.size()) {
    return true;
  }

#ifdef _MSC_VER
  struct timeval timeout = {0, 0};
  fd_set writeset = m_fds;
  if (select(0, 0, &writeset, 0, &timeout) <= 0) {
    return false;
  }
#else
  struct pollfd pfd = {m_socket, POLLOUT, 0};
  if (poll(&pfd, 1, 0) <= 0) {
    return false;
  }
#endif

  const std::string &msg = m_sendQueue.front();

  ssize_t result = socket_send(m_socket, msg.c_str() + m_sendLength, msg.length() - m_sendLength);

  if (result > 0) {
    m_sendLength += result;
  }

  if (m_sendLength == msg.length()) {
    m_sendLength = 0;
    m_sendQueue.pop_front();
  }

  return !m_sendQueue.size();
}